

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O2

bool __thiscall SimpleString::containsNoCase(SimpleString *this,SimpleString *other)

{
  bool bVar1;
  SimpleString SStack_38;
  SimpleString local_28;
  
  lowerCase(&SStack_38);
  lowerCase(&local_28);
  bVar1 = contains(&SStack_38,&local_28);
  ~SimpleString(&local_28);
  ~SimpleString(&SStack_38);
  return bVar1;
}

Assistant:

bool SimpleString::containsNoCase(const SimpleString& other) const
{
    return lowerCase().contains(other.lowerCase());
}